

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O2

ggml_tensor * ggml_l2_norm(ggml_context *ctx,ggml_tensor *a,float eps)

{
  ggml_tensor *pgVar1;
  
  pgVar1 = ggml_l2_norm_impl(ctx,a,eps,false);
  return pgVar1;
}

Assistant:

struct ggml_tensor * ggml_l2_norm(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        float                 eps) {
    return ggml_l2_norm_impl(ctx, a, eps, false);
}